

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O0

float128 commonNaNToFloat128(commonNaNT a,float_status *status)

{
  uint64_t local_30;
  float128 z;
  float_status *status_local;
  ulong local_10;
  
  z.high = (uint64_t)status;
  if (status->default_nan_mode == '\0') {
    shift128Right(a.high,a.low,0x10,&z.low,&local_30);
    local_10 = (ulong)a.sign << 0x3f | 0x7fff000000000000 | z.low;
    status_local = (float_status *)local_30;
  }
  else {
    _status_local = float128_default_nan_tricore(status);
  }
  return _status_local;
}

Assistant:

static float128 commonNaNToFloat128(commonNaNT a, float_status *status)
{
    float128 z;

    if (status->default_nan_mode) {
        return float128_default_nan(status);
    }

    shift128Right(a.high, a.low, 16, &z.high, &z.low);
    z.high |= (((uint64_t)a.sign) << 63) | UINT64_C(0x7FFF000000000000);
    return z;
}